

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFunc.c
# Opt level: O0

char * Abc_ConvertBddToSop(Mem_Flex_t *pMan,DdManager *dd,DdNode *bFuncOn,DdNode *bFuncOnDc,
                          int nFanins,int fAllPrimes,Vec_Str_t *vCube,int fMode)

{
  bool bVar1;
  DdNode *pDVar2;
  int iVar3;
  DdNode *pDVar4;
  uint local_80;
  int fPhase;
  int nCubes1;
  int nCubes0;
  int nCubes;
  DdNode *zCover1;
  DdNode *zCover0;
  DdNode *zCover;
  DdNode *bCover;
  DdNode *bFuncNew;
  char *pSop;
  int local_38;
  int fVerify;
  int fAllPrimes_local;
  int nFanins_local;
  DdNode *bFuncOnDc_local;
  DdNode *bFuncOn_local;
  DdManager *dd_local;
  Mem_Flex_t *pMan_local;
  
  pSop._4_4_ = 0;
  local_38 = fAllPrimes;
  fVerify = nFanins;
  _fAllPrimes_local = bFuncOnDc;
  bFuncOnDc_local = bFuncOn;
  bFuncOn_local = &dd->sentinel;
  dd_local = (DdManager *)pMan;
  if ((bFuncOn != bFuncOnDc) && (iVar3 = Cudd_bddLeq(dd,bFuncOn,bFuncOnDc), iVar3 == 0)) {
    __assert_fail("bFuncOn == bFuncOnDc || Cudd_bddLeq( dd, bFuncOn, bFuncOnDc )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFunc.c"
                  ,0xdd,
                  "char *Abc_ConvertBddToSop(Mem_Flex_t *, DdManager *, DdNode *, DdNode *, int, int, Vec_Str_t *, int)"
                 );
  }
  if ((*(int *)((ulong)bFuncOnDc_local & 0xfffffffffffffffe) == 0x7fffffff) ||
     (*(int *)((ulong)_fAllPrimes_local & 0xfffffffffffffffe) == 0x7fffffff)) {
    if (dd_local == (DdManager *)0x0) {
      bFuncNew = (DdNode *)malloc((long)(fVerify + 4));
    }
    else {
      bFuncNew = (DdNode *)Mem_FlexEntryFetch((Mem_Flex_t *)dd_local,fVerify + 4);
    }
    pDVar2 = bFuncOnDc_local;
    *(undefined1 *)&bFuncNew->index = 0x20;
    pDVar4 = Cudd_ReadOne((DdManager *)bFuncOn_local);
    *(char *)((long)&bFuncNew->index + 1) = (pDVar2 == pDVar4) + '0';
    *(undefined1 *)((long)&bFuncNew->index + 2) = 10;
    *(undefined1 *)((long)&bFuncNew->index + 3) = 0;
    pMan_local = (Mem_Flex_t *)bFuncNew;
  }
  else {
    if (fMode == -1) {
      if (local_38 != 0) {
        __assert_fail("fAllPrimes == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFunc.c"
                      ,0xed,
                      "char *Abc_ConvertBddToSop(Mem_Flex_t *, DdManager *, DdNode *, DdNode *, int, int, Vec_Str_t *, int)"
                     );
      }
      zCover = Cudd_zddIsop((DdManager *)bFuncOn_local,(DdNode *)((ulong)_fAllPrimes_local ^ 1),
                            (DdNode *)((ulong)bFuncOnDc_local ^ 1),&zCover1);
      Cudd_Ref(zCover1);
      Cudd_Ref(zCover);
      Cudd_RecursiveDeref((DdManager *)bFuncOn_local,zCover);
      nCubes1 = Abc_CountZddCubes((DdManager *)bFuncOn_local,zCover1);
      zCover = Cudd_zddIsop((DdManager *)bFuncOn_local,bFuncOnDc_local,_fAllPrimes_local,
                            (DdNode **)&nCubes0);
      Cudd_Ref(_nCubes0);
      Cudd_Ref(zCover);
      Cudd_RecursiveDeref((DdManager *)bFuncOn_local,zCover);
      iVar3 = Abc_CountZddCubes((DdManager *)bFuncOn_local,_nCubes0);
      bVar1 = nCubes1 < iVar3;
      if (bVar1) {
        zCover0 = zCover1;
        Cudd_RecursiveDerefZdd((DdManager *)bFuncOn_local,_nCubes0);
      }
      else {
        zCover0 = _nCubes0;
        Cudd_RecursiveDerefZdd((DdManager *)bFuncOn_local,zCover1);
        nCubes1 = iVar3;
      }
      local_80 = (uint)!bVar1;
    }
    else if (fMode == 0) {
      if (local_38 == 0) {
        zCover = Cudd_zddIsop((DdManager *)bFuncOn_local,(DdNode *)((ulong)_fAllPrimes_local ^ 1),
                              (DdNode *)((ulong)bFuncOnDc_local ^ 1),&zCover0);
        Cudd_Ref(zCover0);
        Cudd_Ref(zCover);
        Cudd_RecursiveDeref((DdManager *)bFuncOn_local,zCover);
      }
      else {
        zCover0 = Extra_zddPrimes((DdManager *)bFuncOn_local,
                                  (DdNode *)((ulong)_fAllPrimes_local ^ 1));
        Cudd_Ref(zCover0);
      }
      nCubes1 = Abc_CountZddCubes((DdManager *)bFuncOn_local,zCover0);
      local_80 = 0;
    }
    else {
      if (fMode != 1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFunc.c"
                      ,0x133,
                      "char *Abc_ConvertBddToSop(Mem_Flex_t *, DdManager *, DdNode *, DdNode *, int, int, Vec_Str_t *, int)"
                     );
      }
      if (local_38 == 0) {
        zCover = Cudd_zddIsop((DdManager *)bFuncOn_local,bFuncOnDc_local,_fAllPrimes_local,&zCover0)
        ;
        Cudd_Ref(zCover0);
        Cudd_Ref(zCover);
        Cudd_RecursiveDeref((DdManager *)bFuncOn_local,zCover);
      }
      else {
        zCover0 = Extra_zddPrimes((DdManager *)bFuncOn_local,_fAllPrimes_local);
        Cudd_Ref(zCover0);
      }
      nCubes1 = Abc_CountZddCubes((DdManager *)bFuncOn_local,zCover0);
      local_80 = 1;
    }
    if (nCubes1 < 0x186a1) {
      if (dd_local == (DdManager *)0x0) {
        bFuncNew = (DdNode *)malloc((long)((fVerify + 3) * nCubes1 + 1));
      }
      else {
        bFuncNew = (DdNode *)Mem_FlexEntryFetch((Mem_Flex_t *)dd_local,(fVerify + 3) * nCubes1 + 1);
      }
      *(undefined1 *)((long)&bFuncNew->index + (long)((fVerify + 3) * nCubes1)) = 0;
      Vec_StrFill(vCube,fVerify,'-');
      Vec_StrPush(vCube,'\0');
      Abc_ConvertZddToSop((DdManager *)bFuncOn_local,zCover0,(char *)bFuncNew,fVerify,vCube,local_80
                         );
      Cudd_RecursiveDerefZdd((DdManager *)bFuncOn_local,zCover0);
      if (pSop._4_4_ != 0) {
        bCover = Abc_ConvertSopToBdd((DdManager *)bFuncOn_local,(char *)bFuncNew,(DdNode **)0x0);
        Cudd_Ref(bCover);
        if (bFuncOnDc_local == _fAllPrimes_local) {
          if (bCover != bFuncOnDc_local) {
            printf("Verification failed.\n");
          }
        }
        else {
          iVar3 = Cudd_bddLeq((DdManager *)bFuncOn_local,bFuncOnDc_local,bCover);
          if ((iVar3 == 0) ||
             (iVar3 = Cudd_bddLeq((DdManager *)bFuncOn_local,bCover,_fAllPrimes_local), iVar3 == 0))
          {
            printf("Verification failed.\n");
          }
        }
        Cudd_RecursiveDeref((DdManager *)bFuncOn_local,bCover);
      }
      pMan_local = (Mem_Flex_t *)bFuncNew;
    }
    else {
      Cudd_RecursiveDerefZdd((DdManager *)bFuncOn_local,zCover0);
      printf("The number of cubes exceeded the predefined limit (%d).\n",100000);
      pMan_local = (Mem_Flex_t *)0x0;
    }
  }
  return (char *)pMan_local;
}

Assistant:

char * Abc_ConvertBddToSop( Mem_Flex_t * pMan, DdManager * dd, DdNode * bFuncOn, DdNode * bFuncOnDc, int nFanins, int fAllPrimes, Vec_Str_t * vCube, int fMode )
{
    int fVerify = 0;
    char * pSop;
    DdNode * bFuncNew, * bCover, * zCover, * zCover0, * zCover1;
    int nCubes = 0, nCubes0, nCubes1, fPhase = 0;

    assert( bFuncOn == bFuncOnDc || Cudd_bddLeq( dd, bFuncOn, bFuncOnDc ) );
    if ( Cudd_IsConstant(bFuncOn) || Cudd_IsConstant(bFuncOnDc) )
    {
        if ( pMan )
            pSop = Mem_FlexEntryFetch( pMan, nFanins + 4 );
        else
            pSop = ABC_ALLOC( char, nFanins + 4 );
        pSop[0] = ' ';
        pSop[1] = '0' + (int)(bFuncOn == Cudd_ReadOne(dd));
        pSop[2] = '\n';
        pSop[3] = '\0';
        return pSop;
    }

    if ( fMode == -1 )
    { // try both phases
        assert( fAllPrimes == 0 );

        // get the ZDD of the negative polarity
        bCover = Cudd_zddIsop( dd, Cudd_Not(bFuncOnDc), Cudd_Not(bFuncOn), &zCover0 );
        Cudd_Ref( zCover0 );
        Cudd_Ref( bCover );
        Cudd_RecursiveDeref( dd, bCover );
        nCubes0 = Abc_CountZddCubes( dd, zCover0 );

        // get the ZDD of the positive polarity
        bCover = Cudd_zddIsop( dd, bFuncOn, bFuncOnDc, &zCover1 );
        Cudd_Ref( zCover1 );
        Cudd_Ref( bCover );
        Cudd_RecursiveDeref( dd, bCover );
        nCubes1 = Abc_CountZddCubes( dd, zCover1 );

        // compare the number of cubes
        if ( nCubes1 <= nCubes0 )
        { // use positive polarity
            nCubes = nCubes1;
            zCover = zCover1;
            Cudd_RecursiveDerefZdd( dd, zCover0 );
            fPhase = 1;
        }
        else
        { // use negative polarity
            nCubes = nCubes0;
            zCover = zCover0;
            Cudd_RecursiveDerefZdd( dd, zCover1 );
            fPhase = 0;
        }
    }
    else if ( fMode == 0 )
    {
        // get the ZDD of the negative polarity
        if ( fAllPrimes )
        {
            zCover = Extra_zddPrimes( dd, Cudd_Not(bFuncOnDc) ); 
            Cudd_Ref( zCover );
        }
        else
        {
            bCover = Cudd_zddIsop( dd, Cudd_Not(bFuncOnDc), Cudd_Not(bFuncOn), &zCover );
            Cudd_Ref( zCover );
            Cudd_Ref( bCover );
            Cudd_RecursiveDeref( dd, bCover );
        }
        nCubes = Abc_CountZddCubes( dd, zCover );
        fPhase = 0;
    }
    else if ( fMode == 1 )
    {
        // get the ZDD of the positive polarity
        if ( fAllPrimes )
        {
            zCover = Extra_zddPrimes( dd, bFuncOnDc ); 
            Cudd_Ref( zCover );
        }
        else
        {
            bCover = Cudd_zddIsop( dd, bFuncOn, bFuncOnDc, &zCover );
            Cudd_Ref( zCover );
            Cudd_Ref( bCover );
            Cudd_RecursiveDeref( dd, bCover );
        }
        nCubes = Abc_CountZddCubes( dd, zCover );
        fPhase = 1;
    }
    else
    {
        assert( 0 );
    }

    if ( nCubes > ABC_MAX_CUBES )
    {
        Cudd_RecursiveDerefZdd( dd, zCover );
        printf( "The number of cubes exceeded the predefined limit (%d).\n", ABC_MAX_CUBES );
        return NULL;
    }

    // allocate memory for the cover
    if ( pMan )
        pSop = Mem_FlexEntryFetch( pMan, (nFanins + 3) * nCubes + 1 );
    else 
        pSop = ABC_ALLOC( char, (nFanins + 3) * nCubes + 1 );
    pSop[(nFanins + 3) * nCubes] = 0;
    // create the SOP
    Vec_StrFill( vCube, nFanins, '-' );
    Vec_StrPush( vCube, '\0' );
    Abc_ConvertZddToSop( dd, zCover, pSop, nFanins, vCube, fPhase );
    Cudd_RecursiveDerefZdd( dd, zCover );

    // verify
    if ( fVerify )
    {
        bFuncNew = Abc_ConvertSopToBdd( dd, pSop, NULL );  Cudd_Ref( bFuncNew );
        if ( bFuncOn == bFuncOnDc )
        {
            if ( bFuncNew != bFuncOn )
                printf( "Verification failed.\n" );
        }
        else
        {
            if ( !Cudd_bddLeq(dd, bFuncOn, bFuncNew) || !Cudd_bddLeq(dd, bFuncNew, bFuncOnDc) )
                printf( "Verification failed.\n" );
        }
        Cudd_RecursiveDeref( dd, bFuncNew );
    }
    return pSop;
}